

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_unit_strings.cpp
# Opt level: O3

void __thiscall unitStrings_watthours_Test::TestBody(unitStrings_watthours_Test *this)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  unit_data uVar2;
  precise_unit *ppVar3;
  uint64_t uVar4;
  string *__return_storage_ptr__;
  pointer *__ptr;
  char *pcVar5;
  string str;
  precise_unit local_98;
  string local_88;
  undefined1 local_68 [8];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_60;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_58;
  AssertHelper local_48;
  undefined8 local_40;
  undefined8 local_38;
  undefined8 local_30;
  
  uVar2 = units::detail::unit_data::operator*
                    ((unit_data *)(units::precise::A + 8),(unit_data *)(units::precise::s + 8));
  local_98._8_8_ = ZEXT48((uint)uVar2);
  uVar4 = 0x3ff0000000000000;
  local_98.multiplier_ = (double)&DAT_3ff0000000000000;
  ppVar3 = (precise_unit *)units::getDefaultFlags();
  __return_storage_ptr__ = &local_88;
  units::to_string_abi_cxx11_(__return_storage_ptr__,(units *)&local_98,ppVar3,uVar4);
  testing::internal::CmpHelperEQ<std::__cxx11::string,char[2]>
            ((internal *)local_68,"to_string(precise::A * precise::s)","\"C\"",
             __return_storage_ptr__,(char (*) [2])0x1fef06);
  paVar1 = &local_88.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_88._M_dataplus._M_p != paVar1) {
    operator_delete(local_88._M_dataplus._M_p,local_88.field_2._M_allocated_capacity + 1);
  }
  if (local_68[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_88);
    if (local_60 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar5 = "";
    }
    else {
      pcVar5 = *(char **)local_60;
    }
    __return_storage_ptr__ = (string *)0x1b0;
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_98,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]units/test/test_unit_strings.cpp"
               ,0x1b0,pcVar5);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_98,(Message *)&local_88);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_98);
    if ((long *)local_88._M_dataplus._M_p != (long *)0x0) {
      (**(code **)(*(long *)local_88._M_dataplus._M_p + 8))();
    }
  }
  if (local_60 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)(local_68 + 8),local_60);
  }
  uVar2 = units::detail::unit_data::operator*
                    ((unit_data *)(units::precise::W + 8),(unit_data *)(units::precise::hr + 8));
  local_98._8_8_ = ZEXT48((uint)uVar2);
  local_98.multiplier_ = 3600.0;
  ppVar3 = (precise_unit *)units::getDefaultFlags();
  units::to_string_abi_cxx11_(&local_88,(units *)&local_98,ppVar3,(uint64_t)__return_storage_ptr__);
  testing::internal::CmpHelperEQ<std::__cxx11::string,char[3]>
            ((internal *)local_68,"to_string(precise::W * precise::hr)","\"Wh\"",&local_88,
             (char (*) [3])0x1fb4d4);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_88._M_dataplus._M_p != paVar1) {
    operator_delete(local_88._M_dataplus._M_p,local_88.field_2._M_allocated_capacity + 1);
  }
  if (local_68[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_88);
    if (local_60 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar5 = "";
    }
    else {
      pcVar5 = *(char **)local_60;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_98,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]units/test/test_unit_strings.cpp"
               ,0x1b1,pcVar5);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_98,(Message *)&local_88);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_98);
    if ((long *)local_88._M_dataplus._M_p != (long *)0x0) {
      (**(code **)(*(long *)local_88._M_dataplus._M_p + 8))();
    }
  }
  if (local_60 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)(local_68 + 8),local_60);
  }
  uVar2 = units::detail::unit_data::operator*
                    ((unit_data *)(units::precise::W + 8),(unit_data *)(units::precise::hr + 8));
  local_40 = (ulong)(uint)uVar2;
  local_48.data_ = (AssertHelperData *)0x40ac200000000000;
  local_98.base_units_ =
       units::detail::unit_data::operator*
                 ((unit_data *)&local_40,(unit_data *)(units::precise::iflag + 8));
  uVar4 = (ulong)local_40._4_4_ << 0x20;
  local_98.commodity_ = local_40._4_4_;
  local_98.multiplier_ = 3600.0;
  ppVar3 = (precise_unit *)units::getDefaultFlags();
  units::to_string_abi_cxx11_(&local_88,(units *)&local_98,ppVar3,uVar4);
  testing::internal::CmpHelperEQ<std::__cxx11::string,char[8]>
            ((internal *)local_68,"to_string(precise::W * precise::hr * precise::iflag)",
             "\"Wh*flag\"",&local_88,(char (*) [8])"Wh*flag");
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_88._M_dataplus._M_p != paVar1) {
    operator_delete(local_88._M_dataplus._M_p,local_88.field_2._M_allocated_capacity + 1);
  }
  if (local_68[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_88);
    if (local_60 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar5 = "";
    }
    else {
      pcVar5 = *(char **)local_60;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_98,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]units/test/test_unit_strings.cpp"
               ,0x1b2,pcVar5);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_98,(Message *)&local_88);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_98);
    if ((long *)local_88._M_dataplus._M_p != (long *)0x0) {
      (**(code **)(*(long *)local_88._M_dataplus._M_p + 8))();
    }
  }
  if (local_60 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)(local_68 + 8),local_60);
  }
  uVar2 = units::detail::unit_data::operator*
                    ((unit_data *)(units::precise::W + 8),(unit_data *)(units::precise::hr + 8));
  local_40 = (ulong)(uint)uVar2;
  local_48.data_ = (AssertHelperData *)0x40ac200000000000;
  local_98.base_units_ =
       units::detail::unit_data::operator*
                 ((unit_data *)&local_40,(unit_data *)(units::precise::m + 8));
  uVar4 = (ulong)local_40._4_4_ << 0x20;
  local_98.commodity_ = local_40._4_4_;
  local_98.multiplier_ = 3600.0;
  ppVar3 = (precise_unit *)units::getDefaultFlags();
  units::to_string_abi_cxx11_(&local_88,(units *)&local_98,ppVar3,uVar4);
  testing::internal::CmpHelperEQ<std::__cxx11::string,char[5]>
            ((internal *)local_68,"to_string(precise::W * precise::hr * precise::m)","\"Wh*m\"",
             &local_88,(char (*) [5])0x1fb4e0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_88._M_dataplus._M_p != paVar1) {
    operator_delete(local_88._M_dataplus._M_p,local_88.field_2._M_allocated_capacity + 1);
  }
  if (local_68[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_88);
    if (local_60 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar5 = "";
    }
    else {
      pcVar5 = *(char **)local_60;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_98,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]units/test/test_unit_strings.cpp"
               ,0x1b3,pcVar5);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_98,(Message *)&local_88);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_98);
    if ((long *)local_88._M_dataplus._M_p != (long *)0x0) {
      (**(code **)(*(long *)local_88._M_dataplus._M_p + 8))();
    }
  }
  if (local_60 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)(local_68 + 8),local_60);
  }
  uVar2 = units::detail::unit_data::operator*
                    ((unit_data *)(units::precise::kilo + 8),(unit_data *)(units::precise::W + 8));
  local_40 = (ulong)(uint)uVar2;
  local_48.data_ = (AssertHelperData *)0x408f400000000000;
  local_98.base_units_ =
       units::detail::unit_data::operator*
                 ((unit_data *)&local_40,(unit_data *)(units::precise::h + 8));
  local_98.commodity_ = local_40._4_4_;
  uVar4 = 0x414b774000000000;
  local_98.multiplier_ = 3600000.0;
  ppVar3 = (precise_unit *)units::getDefaultFlags();
  units::to_string_abi_cxx11_(&local_88,(units *)&local_98,ppVar3,uVar4);
  testing::internal::CmpHelperEQ<std::__cxx11::string,char[4]>
            ((internal *)local_68,"to_string(precise::kilo * precise::W * precise::h)","\"kWh\"",
             &local_88,(char (*) [4])0x20c40d);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_88._M_dataplus._M_p != paVar1) {
    operator_delete(local_88._M_dataplus._M_p,local_88.field_2._M_allocated_capacity + 1);
  }
  if (local_68[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_88);
    if (local_60 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar5 = "";
    }
    else {
      pcVar5 = *(char **)local_60;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_98,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]units/test/test_unit_strings.cpp"
               ,0x1b4,pcVar5);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_98,(Message *)&local_88);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_98);
    if ((long *)local_88._M_dataplus._M_p != (long *)0x0) {
      (**(code **)(*(long *)local_88._M_dataplus._M_p + 8))();
    }
  }
  if (local_60 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)(local_68 + 8),local_60);
  }
  uVar2 = units::detail::unit_data::operator*
                    ((unit_data *)(units::precise::mega + 8),(unit_data *)(units::precise::W + 8));
  local_40 = (ulong)(uint)uVar2;
  local_48.data_ = (AssertHelperData *)&DAT_412e848000000000;
  local_98.base_units_ =
       units::detail::unit_data::operator*
                 ((unit_data *)&local_40,(unit_data *)(units::precise::h + 8));
  local_98.commodity_ = local_40._4_4_;
  uVar4 = 0x41ead27480000000;
  local_98.multiplier_ = 3600000000.0;
  ppVar3 = (precise_unit *)units::getDefaultFlags();
  units::to_string_abi_cxx11_(&local_88,(units *)&local_98,ppVar3,uVar4);
  testing::internal::CmpHelperEQ<std::__cxx11::string,char[4]>
            ((internal *)local_68,"to_string(precise::mega * precise::W * precise::h)","\"MWh\"",
             &local_88,(char (*) [4])0x1f9863);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_88._M_dataplus._M_p != paVar1) {
    operator_delete(local_88._M_dataplus._M_p,local_88.field_2._M_allocated_capacity + 1);
  }
  if (local_68[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_88);
    if (local_60 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar5 = "";
    }
    else {
      pcVar5 = *(char **)local_60;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_98,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]units/test/test_unit_strings.cpp"
               ,0x1b5,pcVar5);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_98,(Message *)&local_88);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_98);
    if ((long *)local_88._M_dataplus._M_p != (long *)0x0) {
      (**(code **)(*(long *)local_88._M_dataplus._M_p + 8))();
    }
  }
  if (local_60 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)(local_68 + 8),local_60);
  }
  uVar2 = units::detail::unit_data::operator*
                    ((unit_data *)(units::precise::giga + 8),(unit_data *)(units::precise::W + 8));
  local_40 = (ulong)(uint)uVar2;
  local_48.data_ = (AssertHelperData *)0x41cdcd6500000000;
  local_98.base_units_ =
       units::detail::unit_data::operator*
                 ((unit_data *)&local_40,(unit_data *)(units::precise::h + 8));
  uVar4 = (ulong)local_40._4_4_ << 0x20;
  local_98.commodity_ = local_40._4_4_;
  local_98.multiplier_ = (double)&DAT_428a3185c5000000;
  ppVar3 = (precise_unit *)units::getDefaultFlags();
  units::to_string_abi_cxx11_(&local_88,(units *)&local_98,ppVar3,uVar4);
  testing::internal::CmpHelperEQ<std::__cxx11::string,char[4]>
            ((internal *)local_68,"to_string(precise::giga * precise::W * precise::h)","\"GWh\"",
             &local_88,(char (*) [4])0x1fb4d3);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_88._M_dataplus._M_p != paVar1) {
    operator_delete(local_88._M_dataplus._M_p,local_88.field_2._M_allocated_capacity + 1);
  }
  if (local_68[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_88);
    if (local_60 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar5 = "";
    }
    else {
      pcVar5 = (local_60->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_98,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]units/test/test_unit_strings.cpp"
               ,0x1b6,pcVar5);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_98,(Message *)&local_88);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_98);
    if ((long *)local_88._M_dataplus._M_p != (long *)0x0) {
      (**(code **)(*(long *)local_88._M_dataplus._M_p + 8))();
    }
  }
  if (local_60 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)(local_68 + 8),local_60);
  }
  uVar2 = units::detail::unit_data::operator*
                    ((unit_data *)(units::precise::giga + 8),(unit_data *)(units::precise::W + 8));
  local_40 = (ulong)(uint)uVar2;
  local_48.data_ = (AssertHelperData *)0x41cdcd6500000000;
  local_98.base_units_ =
       units::detail::unit_data::operator*
                 ((unit_data *)&local_40,(unit_data *)(units::precise::h + 8));
  uVar4 = (ulong)local_40._4_4_ << 0x20;
  local_98.commodity_ = local_40._4_4_;
  local_98.multiplier_ = (double)&DAT_428a3185c5000000;
  _local_68 = units::precise_unit::operator/((precise_unit *)units::precise::currency,&local_98);
  ppVar3 = (precise_unit *)units::getDefaultFlags();
  units::to_string_abi_cxx11_(&local_88,(units *)local_68,ppVar3,uVar4);
  testing::internal::CmpHelperEQ<std::__cxx11::string,char[6]>
            ((internal *)local_68,"str","\"$/GWh\"",&local_88,(char (*) [6])"$/GWh");
  if (local_68[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_98);
    if (local_60 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar5 = "";
    }
    else {
      pcVar5 = *(char **)local_60;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_48,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]units/test/test_unit_strings.cpp"
               ,0x1ba,pcVar5);
    testing::internal::AssertHelper::operator=(&local_48,(Message *)&local_98);
    testing::internal::AssertHelper::~AssertHelper(&local_48);
    if ((long *)local_98.multiplier_ != (long *)0x0) {
      (**(code **)(*(long *)local_98.multiplier_ + 8))();
    }
  }
  if (local_60 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)(local_68 + 8),local_60);
  }
  uVar2 = units::detail::unit_data::operator*
                    ((unit_data *)(units::precise::giga + 8),(unit_data *)(units::precise::W + 8));
  local_30 = (ulong)(uint)uVar2;
  local_38 = 0x41cdcd6500000000;
  local_40._0_4_ =
       units::detail::unit_data::operator*
                 ((unit_data *)&local_30,(unit_data *)(units::precise::h + 8));
  local_40._4_4_ = local_30._4_4_;
  local_48.data_ = (AssertHelperData *)&DAT_428a3185c5000000;
  local_98.base_units_ =
       units::detail::unit_data::operator*
                 ((unit_data *)(units::precise::m + 8),(unit_data *)&local_40);
  uVar4 = (ulong)local_40._4_4_ << 0x20;
  local_98.commodity_ = local_40._4_4_;
  local_98.multiplier_ = (double)&DAT_428a3185c5000000;
  ppVar3 = (precise_unit *)units::getDefaultFlags();
  units::to_string_abi_cxx11_((string *)local_68,(units *)&local_98,ppVar3,uVar4);
  std::__cxx11::string::operator=((string *)&local_88,(string *)local_68);
  if (local_68 != (undefined1  [8])&local_58) {
    operator_delete((void *)local_68,local_58._M_allocated_capacity + 1);
  }
  testing::internal::CmpHelperEQ<std::__cxx11::string,char[6]>
            ((internal *)local_68,"str","\"GWh*m\"",&local_88,(char (*) [6])"GWh*m");
  if (local_68[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_98);
    if (local_60 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar5 = "";
    }
    else {
      pcVar5 = *(char **)local_60;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_48,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]units/test/test_unit_strings.cpp"
               ,0x1bd,pcVar5);
    testing::internal::AssertHelper::operator=(&local_48,(Message *)&local_98);
    testing::internal::AssertHelper::~AssertHelper(&local_48);
    if ((long *)local_98.multiplier_ != (long *)0x0) {
      (**(code **)(*(long *)local_98.multiplier_ + 8))();
    }
  }
  if (local_60 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)(local_68 + 8),local_60);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_88._M_dataplus._M_p != paVar1) {
    operator_delete(local_88._M_dataplus._M_p,local_88.field_2._M_allocated_capacity + 1);
  }
  return;
}

Assistant:

TEST(stringToUnits, equivalents2)
{
    EXPECT_EQ(unit_from_string("in us"), unit_from_string("in_us"));
    EXPECT_EQ(unit_from_string("us in"), unit_from_string("in_us"));
    EXPECT_EQ(unit_from_string("[in_us]"), unit_from_string("inch - US"));
    EXPECT_EQ(unit_from_string("CXCUN[1]^-1"), unit_from_string("/[arb'U]"));
    EXPECT_EQ(
        unit_from_string("[CCID_50]"), unit_from_string("CCID<sub>50</sub> "));
    EXPECT_EQ(
        unit_from_string("[CCID_50]"),
        unit_from_string("CCID<sub>50<\\/sub> "));
    EXPECT_EQ(
        unit_from_string("/100 neutrophils"),
        unit_from_string("/100{neutrophils}"));
    EXPECT_EQ(unit_from_string("carat/cubic inch"), unit_from_string("ct/in3"));
    EXPECT_EQ(
        unit_from_string("10.(UN.S)/(CM5.M2)", case_insensitive),
        unit_from_string("10.uN.s/(cm5.m2)"));
    EXPECT_EQ(unit_from_string("imperial miles"), unit_from_string("mi_br"));
    EXPECT_EQ(unit_from_string("cup us"), precise::us::cup);
    EXPECT_EQ(unit_from_string(" per sec"), unit_from_string("/s"));
    EXPECT_EQ(unit_from_string("ampere-hour"), unit_from_string("A.h"));
    EXPECT_EQ(
        unit_from_string("mL/cm[H2O]"),
        unit_from_string("milliliter per centimeter of water"));
    EXPECT_EQ(unit_from_string("sq m"), unit_from_string("m2"));
    EXPECT_EQ(unit_from_string("U/ 12hrs"), unit_from_string("U/(12.h)"));
    EXPECT_EQ(unit_from_string("Ncm"), unit_from_string("N.cm"));
    EXPECT_EQ(unit_from_string("ohm reciprocal"), unit_from_string("mho"));
    EXPECT_EQ(unit_from_string("per mins"), unit_from_string("/min"));
    EXPECT_EQ(unit_from_string("/100 WBCs"), unit_from_string("/100{WBCs}"));

    EXPECT_EQ(
        unit_from_string("lumen meters squared"), unit_from_string("lm.m2"));
}